

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_get_length_in_seconds(ma_data_source *pDataSource,float *pLength)

{
  ma_result mVar1;
  uint uVar2;
  ma_data_source_base *pDataSourceBase;
  float fVar3;
  ma_uint64 lengthInPCMFrames;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  long local_38;
  uint local_2c;
  undefined1 local_28 [4];
  undefined1 local_24 [4];
  
  if (pLength != (float *)0x0) {
    *pLength = 0.0;
    local_38 = 0;
    if (pDataSource == (ma_data_source *)0x0) {
      mVar1 = MA_INVALID_ARGS;
    }
    else if (*(long *)((long)pDataSource + 0x10) == -1) {
      if (*(code **)(*pDataSource + 0x20) == (code *)0x0) {
        mVar1 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar1 = (**(code **)(*pDataSource + 0x20))(pDataSource,&local_38);
      }
    }
    else {
      local_38 = *(long *)((long)pDataSource + 0x10) - *(long *)((long)pDataSource + 8);
      mVar1 = MA_SUCCESS;
    }
    if (mVar1 == MA_SUCCESS) {
      fVar3 = 0.0;
      if (pDataSource == (ma_data_source *)0x0) {
        mVar1 = MA_INVALID_ARGS;
      }
      else if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
        mVar1 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,local_24,local_28,&local_2c,0,0);
        uVar2 = 0;
        if (mVar1 == MA_SUCCESS) {
          uVar2 = local_2c;
        }
        fVar3 = (float)uVar2;
      }
      if (mVar1 == MA_SUCCESS) {
        *pLength = (float)local_38 / fVar3;
        mVar1 = MA_SUCCESS;
      }
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_seconds(ma_data_source* pDataSource, float* pLength)
{
    ma_result result;
    ma_uint64 lengthInPCMFrames;
    ma_uint32 sampleRate;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    result = ma_data_source_get_length_in_pcm_frames(pDataSource, &lengthInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pLength = (ma_int64)lengthInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}